

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverb.cpp
# Opt level: O1

void anon_unknown.dwarf_1957ff::StdReverb_setParamf(EffectProps *props,ALenum param,float val)

{
  effect_exception *this;
  
  switch(param) {
  case 1:
    if ((0.0 <= val) && (val <= 1.0)) {
LAB_0014dc7c:
      (props->Reverb).Density = val;
      return;
    }
    this = (effect_exception *)__cxa_allocate_exception(0x30);
    effect_exception::effect_exception(this,0xa003,"Reverb density out of range");
    break;
  case 2:
    if ((0.0 <= val) && (val <= 1.0)) {
      props = (EffectProps *)&(props->Reverb).Diffusion;
      goto LAB_0014dc7c;
    }
    this = (effect_exception *)__cxa_allocate_exception(0x30);
    effect_exception::effect_exception(this,0xa003,"Reverb diffusion out of range");
    break;
  case 3:
    if ((0.0 <= val) && (val <= 1.0)) {
      props = (EffectProps *)&(props->Reverb).Gain;
      goto LAB_0014dc7c;
    }
    this = (effect_exception *)__cxa_allocate_exception(0x30);
    effect_exception::effect_exception(this,0xa003,"Reverb gain out of range");
    break;
  case 4:
    if ((0.0 <= val) && (val <= 1.0)) {
      props = (EffectProps *)&(props->Reverb).GainHF;
      goto LAB_0014dc7c;
    }
    this = (effect_exception *)__cxa_allocate_exception(0x30);
    effect_exception::effect_exception(this,0xa003,"Reverb gainhf out of range");
    break;
  case 5:
    if ((0.1 <= val) && (val <= 20.0)) {
      props = (EffectProps *)&(props->Reverb).DecayTime;
      goto LAB_0014dc7c;
    }
    this = (effect_exception *)__cxa_allocate_exception(0x30);
    effect_exception::effect_exception(this,0xa003,"Reverb decay time out of range");
    break;
  case 6:
    if ((0.1 <= val) && (val <= 2.0)) {
      props = (EffectProps *)&(props->Reverb).DecayHFRatio;
      goto LAB_0014dc7c;
    }
    this = (effect_exception *)__cxa_allocate_exception(0x30);
    effect_exception::effect_exception(this,0xa003,"Reverb decay hfratio out of range");
    break;
  case 7:
    if ((0.0 <= val) && (val <= 3.16)) {
      props = (EffectProps *)&(props->Reverb).ReflectionsGain;
      goto LAB_0014dc7c;
    }
    this = (effect_exception *)__cxa_allocate_exception(0x30);
    effect_exception::effect_exception(this,0xa003,"Reverb reflections gain out of range");
    break;
  case 8:
    if ((0.0 <= val) && (val <= 0.3)) {
      props = (EffectProps *)&(props->Reverb).ReflectionsDelay;
      goto LAB_0014dc7c;
    }
    this = (effect_exception *)__cxa_allocate_exception(0x30);
    effect_exception::effect_exception(this,0xa003,"Reverb reflections delay out of range");
    break;
  case 9:
    if ((0.0 <= val) && (val <= 10.0)) {
      props = (EffectProps *)&(props->Reverb).LateReverbGain;
      goto LAB_0014dc7c;
    }
    this = (effect_exception *)__cxa_allocate_exception(0x30);
    effect_exception::effect_exception(this,0xa003,"Reverb late reverb gain out of range");
    break;
  case 10:
    if ((0.0 <= val) && (val <= 0.1)) {
      props = (EffectProps *)&(props->Reverb).LateReverbDelay;
      goto LAB_0014dc7c;
    }
    this = (effect_exception *)__cxa_allocate_exception(0x30);
    effect_exception::effect_exception(this,0xa003,"Reverb late reverb delay out of range");
    break;
  case 0xb:
    if ((0.892 <= val) && (val <= 1.0)) {
      props = (EffectProps *)&(props->Reverb).AirAbsorptionGainHF;
      goto LAB_0014dc7c;
    }
    this = (effect_exception *)__cxa_allocate_exception(0x30);
    effect_exception::effect_exception(this,0xa003,"Reverb air absorption gainhf out of range");
    break;
  case 0xc:
    if ((0.0 <= val) && (val <= 10.0)) {
      props = (EffectProps *)&(props->Reverb).RoomRolloffFactor;
      goto LAB_0014dc7c;
    }
    this = (effect_exception *)__cxa_allocate_exception(0x30);
    effect_exception::effect_exception(this,0xa003,"Reverb room rolloff factor out of range");
    break;
  default:
    this = (effect_exception *)__cxa_allocate_exception(0x30);
    effect_exception::effect_exception
              (this,0xa002,"Invalid reverb float property 0x%04x",(ulong)(uint)param);
  }
  __cxa_throw(this,&effect_exception::typeinfo,al::base_exception::~base_exception);
}

Assistant:

void StdReverb_setParamf(EffectProps *props, ALenum param, float val)
{
    switch(param)
    {
    case AL_REVERB_DENSITY:
        if(!(val >= AL_REVERB_MIN_DENSITY && val <= AL_REVERB_MAX_DENSITY))
            throw effect_exception{AL_INVALID_VALUE, "Reverb density out of range"};
        props->Reverb.Density = val;
        break;

    case AL_REVERB_DIFFUSION:
        if(!(val >= AL_REVERB_MIN_DIFFUSION && val <= AL_REVERB_MAX_DIFFUSION))
            throw effect_exception{AL_INVALID_VALUE, "Reverb diffusion out of range"};
        props->Reverb.Diffusion = val;
        break;

    case AL_REVERB_GAIN:
        if(!(val >= AL_REVERB_MIN_GAIN && val <= AL_REVERB_MAX_GAIN))
            throw effect_exception{AL_INVALID_VALUE, "Reverb gain out of range"};
        props->Reverb.Gain = val;
        break;

    case AL_REVERB_GAINHF:
        if(!(val >= AL_REVERB_MIN_GAINHF && val <= AL_REVERB_MAX_GAINHF))
            throw effect_exception{AL_INVALID_VALUE, "Reverb gainhf out of range"};
        props->Reverb.GainHF = val;
        break;

    case AL_REVERB_DECAY_TIME:
        if(!(val >= AL_REVERB_MIN_DECAY_TIME && val <= AL_REVERB_MAX_DECAY_TIME))
            throw effect_exception{AL_INVALID_VALUE, "Reverb decay time out of range"};
        props->Reverb.DecayTime = val;
        break;

    case AL_REVERB_DECAY_HFRATIO:
        if(!(val >= AL_REVERB_MIN_DECAY_HFRATIO && val <= AL_REVERB_MAX_DECAY_HFRATIO))
            throw effect_exception{AL_INVALID_VALUE, "Reverb decay hfratio out of range"};
        props->Reverb.DecayHFRatio = val;
        break;

    case AL_REVERB_REFLECTIONS_GAIN:
        if(!(val >= AL_REVERB_MIN_REFLECTIONS_GAIN && val <= AL_REVERB_MAX_REFLECTIONS_GAIN))
            throw effect_exception{AL_INVALID_VALUE, "Reverb reflections gain out of range"};
        props->Reverb.ReflectionsGain = val;
        break;

    case AL_REVERB_REFLECTIONS_DELAY:
        if(!(val >= AL_REVERB_MIN_REFLECTIONS_DELAY && val <= AL_REVERB_MAX_REFLECTIONS_DELAY))
            throw effect_exception{AL_INVALID_VALUE, "Reverb reflections delay out of range"};
        props->Reverb.ReflectionsDelay = val;
        break;

    case AL_REVERB_LATE_REVERB_GAIN:
        if(!(val >= AL_REVERB_MIN_LATE_REVERB_GAIN && val <= AL_REVERB_MAX_LATE_REVERB_GAIN))
            throw effect_exception{AL_INVALID_VALUE, "Reverb late reverb gain out of range"};
        props->Reverb.LateReverbGain = val;
        break;

    case AL_REVERB_LATE_REVERB_DELAY:
        if(!(val >= AL_REVERB_MIN_LATE_REVERB_DELAY && val <= AL_REVERB_MAX_LATE_REVERB_DELAY))
            throw effect_exception{AL_INVALID_VALUE, "Reverb late reverb delay out of range"};
        props->Reverb.LateReverbDelay = val;
        break;

    case AL_REVERB_AIR_ABSORPTION_GAINHF:
        if(!(val >= AL_REVERB_MIN_AIR_ABSORPTION_GAINHF && val <= AL_REVERB_MAX_AIR_ABSORPTION_GAINHF))
            throw effect_exception{AL_INVALID_VALUE, "Reverb air absorption gainhf out of range"};
        props->Reverb.AirAbsorptionGainHF = val;
        break;

    case AL_REVERB_ROOM_ROLLOFF_FACTOR:
        if(!(val >= AL_REVERB_MIN_ROOM_ROLLOFF_FACTOR && val <= AL_REVERB_MAX_ROOM_ROLLOFF_FACTOR))
            throw effect_exception{AL_INVALID_VALUE, "Reverb room rolloff factor out of range"};
        props->Reverb.RoomRolloffFactor = val;
        break;

    default:
        throw effect_exception{AL_INVALID_ENUM, "Invalid reverb float property 0x%04x", param};
    }
}